

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_input_success(mpc_input_t *i,char c,char **o)

{
  long *plVar1;
  long lVar2;
  char *in_RAX;
  char *pcVar3;
  size_t sVar4;
  
  if ((i->type == 2) && (pcVar3 = i->buffer, pcVar3 != (char *)0x0)) {
    lVar2 = (i->state).pos;
    in_RAX = (char *)strlen(pcVar3);
    if ((long)(in_RAX + i->marks->pos) <= lVar2) {
      pcVar3 = (char *)realloc(pcVar3,(size_t)(in_RAX + 2));
      i->buffer = pcVar3;
      sVar4 = strlen(pcVar3);
      pcVar3[sVar4 + 1] = '\0';
      in_RAX = (char *)strlen(pcVar3);
      pcVar3[(long)in_RAX] = c;
    }
  }
  i->last = c;
  (i->state).pos = (i->state).pos + 1;
  plVar1 = &(i->state).col;
  *plVar1 = *plVar1 + 1;
  if (c == '\n') {
    (i->state).col = 0;
    plVar1 = &(i->state).row;
    *plVar1 = *plVar1 + 1;
  }
  if (o != (char **)0x0) {
    pcVar3 = (char *)mpc_malloc(i,2);
    *o = pcVar3;
    *pcVar3 = c;
    in_RAX = *o;
    in_RAX[1] = '\0';
  }
  return (int)in_RAX;
}

Assistant:

static int mpc_input_success(mpc_input_t *i, char c, char **o) {

  if (i->type == MPC_INPUT_PIPE
  &&  i->buffer && !mpc_input_buffer_in_range(i)) {
    i->buffer = realloc(i->buffer, strlen(i->buffer) + 2);
    i->buffer[strlen(i->buffer) + 1] = '\0';
    i->buffer[strlen(i->buffer) + 0] = c;
  }

  i->last = c;
  i->state.pos++;
  i->state.col++;

  if (c == '\n') {
    i->state.col = 0;
    i->state.row++;
  }

  if (o) {
    (*o) = mpc_malloc(i, 2);
    (*o)[0] = c;
    (*o)[1] = '\0';
  }

  return 1;
}